

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Float pbrt::SampleCatmullRom2D
                (span<const_float> nodes1,span<const_float> nodes2,span<const_float> values,
                span<const_float> cdf,Float alpha,Float u,Float *fval,Float *pdf)

{
  float fVar1;
  undefined1 auVar2 [16];
  span<const_float> array;
  span<const_float> array_00;
  span<const_float> array_01;
  span<const_float> array_02;
  span<const_float> array_03;
  span<const_float> array_04;
  anon_class_56_7_ed507bea f;
  span<float> weights_00;
  span<const_float> nodes;
  float fVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  float *pfVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  Float FVar8;
  Float FVar9;
  float in_XMM1_Da;
  float *in_stack_00000018;
  float *in_stack_00000020;
  Float t;
  anon_class_56_7_ed507bea eval;
  Float fhat;
  Float Fhat;
  Float d1;
  Float d0;
  Float width;
  Float x1;
  Float x0;
  Float f1;
  Float f0;
  int idx;
  Float maximum;
  anon_class_24_3_25fc3172 interpolate;
  Float weights [4];
  int offset;
  float (*in_stack_fffffffffffffdc8) [4];
  span<float> *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  int idx_00;
  anon_class_24_3_25fc3172 *in_stack_fffffffffffffde0;
  float *in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf0;
  anon_class_24_3_fe2b71c8 *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  enable_if_t<std::is_integral<int>::value> *in_stack_fffffffffffffe40;
  Float in_stack_fffffffffffffe48;
  Float in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Float in_stack_fffffffffffffe84;
  undefined1 *puVar10;
  float *in_stack_fffffffffffffe88;
  Float *pFVar11;
  size_t in_stack_fffffffffffffe90;
  Float *pFVar12;
  float *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  float local_148;
  undefined1 local_144 [4];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined8 local_f8;
  undefined8 local_f0;
  Float local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  Float local_cc;
  undefined1 **local_c8;
  undefined1 *local_c0;
  float *local_b8;
  int local_ac;
  Float local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  span<const_float> *local_80;
  undefined1 local_58 [20];
  undefined1 local_44 [4];
  float local_40 [2];
  undefined8 local_38;
  undefined8 local_30;
  span<const_float> local_28 [2];
  Float local_4;
  
  idx_00 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_40[0] = in_XMM1_Da;
  local_38 = in_R8;
  local_30 = in_R9;
  pstd::span<float>::span<4ul>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  nodes.n = in_stack_fffffffffffffea0;
  nodes.ptr = in_stack_fffffffffffffe98;
  weights_00.n = in_stack_fffffffffffffe90;
  weights_00.ptr = in_stack_fffffffffffffe88;
  bVar4 = CatmullRomWeights(nodes,in_stack_fffffffffffffe84,
                            (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            weights_00);
  if (bVar4) {
    local_90 = local_58;
    local_88 = local_44;
    local_80 = local_28;
    pstd::span<const_float>::size(local_28);
    array.n = in_stack_fffffffffffffdf0;
    array.ptr = in_stack_fffffffffffffde8;
    local_94 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()
                         (in_stack_fffffffffffffde0,array,idx_00);
    local_40[0] = local_94 * local_40[0];
    pstd::span<const_float>::size(local_28);
    local_c8 = &local_90;
    local_b8 = local_40;
    local_c0 = &stack0x00000008;
    sVar6 = FindInterval<pbrt::SampleCatmullRom2D(pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,float,float,float*,float*)::__1>
                      (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_ac = (int)sVar6;
    local_e0 = local_38;
    local_d8 = local_30;
    array_00.n = in_stack_fffffffffffffdf0;
    array_00.ptr = in_stack_fffffffffffffde8;
    local_cc = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()
                         (in_stack_fffffffffffffde0,array_00,idx_00);
    local_f8 = local_38;
    local_f0 = local_30;
    array_01.n = in_stack_fffffffffffffdf0;
    array_01.ptr = in_stack_fffffffffffffde8;
    local_e4 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()
                         (in_stack_fffffffffffffde0,array_01,idx_00);
    pfVar7 = pstd::span<const_float>::operator[](local_28,(long)local_ac);
    local_fc = *pfVar7;
    pfVar7 = pstd::span<const_float>::operator[](local_28,(long)(local_ac + 1));
    fVar1 = local_40[0];
    local_100 = *pfVar7;
    local_104 = local_100 - local_fc;
    array_02.n = in_stack_fffffffffffffdf0;
    array_02.ptr = in_stack_fffffffffffffde8;
    FVar8 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()
                      (in_stack_fffffffffffffde0,array_02,idx_00);
    FVar9 = local_e4;
    fVar3 = local_104;
    local_40[0] = (fVar1 - FVar8) / local_104;
    if (local_ac < 1) {
      local_108 = local_e4 - local_cc;
    }
    else {
      local_130 = local_38;
      local_128 = local_30;
      array_03.n = in_stack_fffffffffffffdf0;
      array_03.ptr = in_stack_fffffffffffffde8;
      FVar8 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()
                        (in_stack_fffffffffffffde0,array_03,idx_00);
      fVar1 = local_100;
      pfVar7 = pstd::span<const_float>::operator[](local_28,(long)(local_ac + -1));
      local_108 = (fVar3 * (FVar9 - FVar8)) / (fVar1 - *pfVar7);
    }
    iVar5 = local_ac + 2;
    sVar6 = pstd::span<const_float>::size(local_28);
    fVar3 = local_104;
    if ((ulong)(long)iVar5 < sVar6) {
      local_140 = local_38;
      local_138 = local_30;
      array_04.n = in_stack_fffffffffffffdf0;
      array_04.ptr = in_stack_fffffffffffffde8;
      FVar9 = SampleCatmullRom2D::anon_class_24_3_25fc3172::operator()
                        (in_stack_fffffffffffffde0,array_04,idx_00);
      fVar1 = FVar9 - local_cc;
      pfVar7 = pstd::span<const_float>::operator[](local_28,(long)(local_ac + 2));
      local_10c = (fVar3 * fVar1) / (*pfVar7 - local_fc);
    }
    else {
      local_10c = local_e4 - local_cc;
    }
    puVar10 = local_144;
    pFVar11 = &local_cc;
    pFVar12 = &local_108;
    memcpy(&stack0xfffffffffffffe40,&stack0xfffffffffffffe80,0x38);
    f.f0 = (Float *)in_stack_fffffffffffffe68;
    f.Fhat = (Float *)in_stack_fffffffffffffe60;
    f.d0 = (Float *)in_stack_fffffffffffffe70;
    f.d1._0_4_ = in_stack_fffffffffffffe78;
    f.d1._4_4_ = in_stack_fffffffffffffe7c;
    f.f1._0_4_ = (int)puVar10;
    f.f1._4_4_ = (int)((ulong)puVar10 >> 0x20);
    f.fhat = pFVar11;
    f.u = pFVar12;
    FVar9 = NewtonBisection<int,pbrt::SampleCatmullRom2D(pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,pstd::span<float_const>,float,float,float*,float*)::__2>
                      (in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,f,
                       in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
                      );
    if (in_stack_00000018 != (float *)0x0) {
      *in_stack_00000018 = local_148;
    }
    if (in_stack_00000020 != (float *)0x0) {
      *in_stack_00000020 = local_148 / local_94;
    }
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)FVar9),ZEXT416((uint)local_104),ZEXT416((uint)local_fc));
    local_4 = auVar2._0_4_;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

Float SampleCatmullRom2D(pstd::span<const Float> nodes1, pstd::span<const Float> nodes2,
                         pstd::span<const Float> values, pstd::span<const Float> cdf,
                         Float alpha, Float u, Float *fval, Float *pdf) {
    // Determine offset and coefficients for the _alpha_ parameter
    int offset;
    Float weights[4];
    if (!CatmullRomWeights(nodes1, alpha, &offset, weights))
        return 0;

    // Define a lambda function to interpolate table entries
    auto interpolate = [&](pstd::span<const Float> array, int idx) {
        Float value = 0;
        for (int i = 0; i < 4; ++i)
            if (weights[i] != 0)
                value += array[(offset + i) * nodes2.size() + idx] * weights[i];
        return value;
    };

    // Map _u_ to a spline interval by inverting the interpolated _cdf_
    Float maximum = interpolate(cdf, nodes2.size() - 1);
    u *= maximum;
    int idx =
        FindInterval(nodes2.size(), [&](int i) { return interpolate(cdf, i) <= u; });

    // Look up node positions and interpolated function values
    Float f0 = interpolate(values, idx), f1 = interpolate(values, idx + 1);
    Float x0 = nodes2[idx], x1 = nodes2[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;

    // Re-scale _u_ using the interpolated _cdf_
    u = (u - interpolate(cdf, idx)) / width;

    // Approximate derivatives using finite differences of the interpolant
    if (idx > 0)
        d0 = width * (f1 - interpolate(values, idx - 1)) / (x1 - nodes2[idx - 1]);
    else
        d0 = f1 - f0;
    if (idx + 2 < nodes2.size())
        d1 = width * (interpolate(values, idx + 2) - f0) / (nodes2[idx + 2] - x0);
    else
        d1 = f1 - f0;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat =
            EvaluatePolynomial(t, 0, f0, .5f * d0, (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                               .25f * (d0 + d1) + .5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / maximum;
    return x0 + width * t;
}